

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReadWriteUnittest.cpp
# Opt level: O1

void __thiscall ReadWriteUnittest::SetUp(ReadWriteUnittest *this)

{
  Serializer *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  this->iSize = 0xc;
  this->jSize = 0x12;
  this->kSize = 10;
  this->intSize = 4;
  this->doubleSize = 8;
  this->floatSize = 4;
  std::vector<int,_std::allocator<int>_>::resize(&this->fieldInt2,0x78);
  std::vector<int,_std::allocator<int>_>::resize
            (&this->fieldInt3,(long)this->kSize * (long)this->jSize * (long)this->iSize);
  std::vector<double,_std::allocator<double>_>::resize(&this->fieldDouble1,(long)this->jSize);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->fieldDouble3,(long)this->kSize * (long)this->jSize * (long)this->iSize);
  std::vector<float,_std::allocator<float>_>::resize(&this->fieldFloat1,(long)this->jSize);
  std::vector<float,_std::allocator<float>_>::resize
            (&this->fieldFloat3,(long)this->kSize * (long)this->jSize * (long)this->iSize);
  std::vector<int,_std::allocator<int>_>::resize
            (&this->fieldcheckInt2,(long)this->kSize * (long)this->iSize);
  std::vector<int,_std::allocator<int>_>::resize
            (&this->fieldcheckInt3,(long)this->kSize * (long)this->jSize * (long)this->iSize);
  std::vector<double,_std::allocator<double>_>::resize(&this->fieldcheckDouble1,(long)this->jSize);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->fieldcheckDouble3,(long)this->kSize * (long)this->jSize * (long)this->iSize);
  std::vector<float,_std::allocator<float>_>::resize(&this->fieldcheckFloat1,(long)this->jSize);
  std::vector<float,_std::allocator<float>_>::resize
            (&this->fieldcheckFloat3,(long)this->kSize * (long)this->jSize * (long)this->iSize);
  paVar1 = &local_120.field_2;
  local_120._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"./","");
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"ReadWriteUnittest","");
  this_00 = &this->ser;
  ser::Serializer::Init(this_00,&local_120,&local_40,SerializerOpenModeWrite);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar1) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  local_120._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"TestSavepoint","");
  ser::Savepoint::Init(&this->sp,&local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar1) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  local_120._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"int3","");
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"int","");
  ser::Serializer::RegisterField
            (this_00,&local_120,&local_60,this->intSize,this->iSize,this->jSize,this->kSize,1,0,0,0,
             0,0,0,0,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar1) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  local_120._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"int2","");
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"int","");
  ser::Serializer::RegisterField
            (this_00,&local_120,&local_80,this->intSize,this->iSize,1,this->kSize,1,0,0,0,0,0,0,0,0)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar1) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  local_120._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"double3","");
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"double","");
  ser::Serializer::RegisterField
            (this_00,&local_120,&local_a0,this->doubleSize,this->iSize,this->jSize,this->kSize,1,0,0
             ,0,0,0,0,0,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar1) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  local_120._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"double1","");
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"double","");
  ser::Serializer::RegisterField
            (this_00,&local_120,&local_c0,this->doubleSize,1,this->jSize,1,1,0,0,0,0,0,0,0,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar1) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  local_120._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"float3","");
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"float","");
  ser::Serializer::RegisterField
            (this_00,&local_120,&local_e0,this->floatSize,this->iSize,this->jSize,this->kSize,1,0,0,
             0,0,0,0,0,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar1) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  local_120._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"float1","");
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"float","");
  ser::Serializer::RegisterField
            (this_00,&local_120,&local_100,this->floatSize,1,this->jSize,1,1,0,0,0,0,0,0,0,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar1) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  FillFields(this);
  return;
}

Assistant:

void SetUp() {
        iSize = 12;
        jSize = 18;
        kSize = 10;

        intSize = sizeof(int);
        doubleSize = sizeof(double);
        floatSize = sizeof(float);

        // Allocate fields
        fieldInt2.resize(iSize*kSize);
        fieldInt3.resize(iSize*jSize*kSize);
        fieldDouble1.resize(jSize);
        fieldDouble3.resize(iSize*jSize*kSize);
        fieldFloat1.resize(jSize);
        fieldFloat3.resize(iSize*jSize*kSize);
        fieldcheckInt2.resize(iSize*kSize);
        fieldcheckInt3.resize(iSize*jSize*kSize);
        fieldcheckDouble1.resize(jSize);
        fieldcheckDouble3.resize(iSize*jSize*kSize);
        fieldcheckFloat1.resize(jSize);
        fieldcheckFloat3.resize(iSize*jSize*kSize);

        // Initialize serialization objects
        ser.Init("./", "ReadWriteUnittest", SerializerOpenModeWrite);
        sp.Init("TestSavepoint");

        // Register fields
        ser.RegisterField("int3", "int", intSize, iSize, jSize, kSize, 1, 0, 0, 0, 0, 0, 0, 0, 0);
        ser.RegisterField("int2", "int", intSize, iSize, 1, kSize, 1, 0, 0, 0, 0, 0, 0, 0, 0);
        ser.RegisterField("double3", "double", doubleSize, iSize, jSize, kSize, 1, 0, 0, 0, 0, 0, 0, 0, 0);
        ser.RegisterField("double1", "double", doubleSize, 1, jSize, 1, 1, 0, 0, 0, 0, 0, 0, 0, 0);
        ser.RegisterField("float3", "float", floatSize, iSize, jSize, kSize, 1, 0, 0, 0, 0, 0, 0, 0, 0);
        ser.RegisterField("float1", "float", floatSize, 1, jSize, 1, 1, 0, 0, 0, 0, 0, 0, 0, 0);

        FillFields();
    }